

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (PointerBuilder builder,StructSchema schema)

{
  uint uVar1;
  uint uVar2;
  RawBrandedSchema *in_RSI;
  Builder *in_RDI;
  Fault f;
  Schema local_58;
  Schema local_50;
  Reader local_48;
  
  local_58.raw = in_RSI;
  Schema::getProto(&local_48,&local_58);
  if ((0xe0 < local_48._reader.dataSize) &&
     ((*(byte *)((long)local_48._reader.data + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x761,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_48);
  }
  local_50.raw = local_58.raw;
  Schema::getProto(&local_48,&local_50);
  uVar2 = 0;
  uVar1 = 0;
  if (0x7f < local_48._reader.dataSize) {
    uVar1 = (uint)*(ushort *)((long)local_48._reader.data + 0xe);
  }
  if (0xcf < local_48._reader.dataSize) {
    uVar2 = (uint)*(ushort *)((long)local_48._reader.data + 0x18) << 0x10;
  }
  PointerBuilder::getStruct
            (&in_RDI->builder,(PointerBuilder *)&stack0x00000008,(StructSize)(uVar2 | uVar1),
             (word *)0x0);
  (in_RDI->schema).super_Schema.raw = local_58.raw;
  return in_RDI;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}